

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscCore.c
# Opt level: O2

int Ssc_GiaSimulatePattern_rec(Ssc_Man_t *p,Gia_Obj_t *pObj)

{
  Gia_Man_t *pGVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  
  pGVar1 = p->pAig;
  iVar3 = Gia_ObjId(pGVar1,pObj);
  if (pGVar1->nTravIdsAlloc <= iVar3) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x263,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  piVar2 = pGVar1->pTravIds;
  iVar3 = Gia_ObjId(pGVar1,pObj);
  if (piVar2[iVar3] == pGVar1->nTravIds) {
    uVar7 = *(ulong *)pObj;
  }
  else {
    pGVar1 = p->pAig;
    iVar3 = Gia_ObjId(pGVar1,pObj);
    if (pGVar1->nTravIdsAlloc <= iVar3) {
      __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x261,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar3 = pGVar1->nTravIds;
    piVar2 = pGVar1->pTravIds;
    iVar4 = Gia_ObjId(pGVar1,pObj);
    piVar2[iVar4] = iVar3;
    if (pObj->Value == 0xffffffff) {
      uVar6 = Ssc_GiaSimulatePattern_rec(p,pObj + -(*(ulong *)pObj & 0x1fffffff));
      uVar5 = Ssc_GiaSimulatePattern_rec(p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff));
      uVar7 = *(ulong *)pObj;
      uVar6 = ((uint)(uVar7 >> 0x3d) & 1 ^ uVar5) & ((uint)(uVar7 >> 0x1d) & 7 ^ uVar6);
    }
    else {
      iVar3 = Abc_Lit2Var(pObj->Value);
      uVar5 = Ssc_GiaSimulatePatternFraig_rec(p,iVar3);
      uVar6 = Abc_LitIsCompl(pObj->Value);
      uVar6 = uVar6 ^ uVar5;
      uVar7 = *(ulong *)pObj;
    }
    uVar7 = uVar7 & 0xffffffffbfffffff | (ulong)(uVar6 << 0x1e);
    *(ulong *)pObj = uVar7;
  }
  return (uint)(uVar7 >> 0x1e) & 1;
}

Assistant:

int Ssc_GiaSimulatePattern_rec( Ssc_Man_t * p, Gia_Obj_t * pObj )
{
    int Res0, Res1;
    if ( Gia_ObjIsTravIdCurrent(p->pAig, pObj) )
        return pObj->fMark0;
    Gia_ObjSetTravIdCurrent(p->pAig, pObj);
    if ( ~pObj->Value )  // mapping into FRAIG exists - simulate FRAIG
    { 
        Res0 = Ssc_GiaSimulatePatternFraig_rec( p, Abc_Lit2Var(pObj->Value) );
        pObj->fMark0 = Res0 ^ Abc_LitIsCompl(pObj->Value);
    }
    else // mapping into FRAIG does not exist - simulate AIG
    {
        Res0 = Ssc_GiaSimulatePattern_rec( p, Gia_ObjFanin0(pObj) );
        Res1 = Ssc_GiaSimulatePattern_rec( p, Gia_ObjFanin1(pObj) );
        pObj->fMark0 = (Res0 ^ Gia_ObjFaninC0(pObj)) & (Res1 ^ Gia_ObjFaninC1(pObj));
    }
    return pObj->fMark0;
}